

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_thisStringValue(JSContext *ctx,JSValue this_val)

{
  JSValue v;
  int64_t in_RDX;
  JSValueUnion in_RSI;
  JSContext *in_RDI;
  JSObject *p;
  JSValue local_10;
  
  if ((int)in_RDX == -7) {
    v.tag = in_RDX;
    v.u.ptr = in_RSI.ptr;
    local_10 = JS_DupValue(in_RDI,v);
  }
  else if ((((int)in_RDX == -1) && (*(short *)((long)in_RSI.ptr + 6) == 5)) &&
          ((int)*(undefined8 *)((long)in_RSI.ptr + 0x38) == -7)) {
    local_10 = JS_DupValue(in_RDI,*(JSValue *)((long)in_RSI.ptr + 0x30));
  }
  else {
    local_10 = JS_ThrowTypeError(in_RDI,"not a string");
  }
  return local_10;
}

Assistant:

static JSValue js_thisStringValue(JSContext *ctx, JSValueConst this_val)
{
    if (JS_VALUE_GET_TAG(this_val) == JS_TAG_STRING)
        return JS_DupValue(ctx, this_val);

    if (JS_VALUE_GET_TAG(this_val) == JS_TAG_OBJECT) {
        JSObject *p = JS_VALUE_GET_OBJ(this_val);
        if (p->class_id == JS_CLASS_STRING) {
            if (JS_VALUE_GET_TAG(p->u.object_data) == JS_TAG_STRING)
                return JS_DupValue(ctx, p->u.object_data);
        }
    }
    return JS_ThrowTypeError(ctx, "not a string");
}